

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void total_changes(sqlite3_context *context,int NotUsed,sqlite3_value **NotUsed2)

{
  int iVal;
  sqlite3 *db_00;
  sqlite3 *db;
  sqlite3_value **NotUsed2_local;
  int NotUsed_local;
  sqlite3_context *context_local;
  
  db_00 = sqlite3_context_db_handle(context);
  iVal = sqlite3_total_changes(db_00);
  sqlite3_result_int(context,iVal);
  return;
}

Assistant:

static void total_changes(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **NotUsed2
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  UNUSED_PARAMETER2(NotUsed, NotUsed2);
  /* IMP: R-52756-41993 This function is a wrapper around the
  ** sqlite3_total_changes() C/C++ interface. */
  sqlite3_result_int(context, sqlite3_total_changes(db));
}